

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

QPDFFileSpecObjectHelper *
QPDFFileSpecObjectHelper::createFileSpec
          (QPDFFileSpecObjectHelper *__return_storage_ptr__,QPDF *qpdf,string *filename,
          string *fullpath)

{
  function<void_(Pipeline_*)> local_80;
  QPDFEFStreamObjectHelper local_60;
  string *local_28;
  string *fullpath_local;
  string *filename_local;
  QPDF *qpdf_local;
  
  local_28 = fullpath;
  fullpath_local = filename;
  filename_local = (string *)qpdf;
  qpdf_local = (QPDF *)__return_storage_ptr__;
  QUtil::file_provider(&local_80,fullpath);
  QPDFEFStreamObjectHelper::createEFStream(&local_60,qpdf,&local_80);
  createFileSpec(__return_storage_ptr__,qpdf,filename,&local_60);
  QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper(&local_60);
  std::function<void_(Pipeline_*)>::~function(&local_80);
  return __return_storage_ptr__;
}

Assistant:

QPDFFileSpecObjectHelper
QPDFFileSpecObjectHelper::createFileSpec(
    QPDF& qpdf, std::string const& filename, std::string const& fullpath)
{
    return createFileSpec(
        qpdf,
        filename,
        QPDFEFStreamObjectHelper::createEFStream(qpdf, QUtil::file_provider(fullpath)));
}